

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cpp
# Opt level: O1

bool __thiscall Connection::Prepare(Connection *this,RunContext *ctx)

{
  string local_28;
  
  RunContext::MakeOrGetFifo_abi_cxx11_
            (&local_28,ctx,this->input_node,this->input_slot,this->output_node,this->output_slot);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p);
  }
  return local_28._M_string_length != 0;
}

Assistant:

std::string GetFifoName(RunContext& ctx)
    {
        return ctx.MakeOrGetFifo(input_node, input_slot, output_node, output_slot);
    }